

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_variable_path.c
# Opt level: O1

char * environment_variable_path_create
                 (char *name,char *default_path,size_t default_path_size,size_t *env_size)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  size_t sVar4;
  size_t __size;
  
  pcVar3 = getenv(name);
  if (pcVar3 == (char *)0x0) {
    __n = default_path_size - 1;
    if (default_path == (char *)0x0) {
      __n = 0;
      default_path = "";
    }
  }
  else {
    __n = strlen(pcVar3);
    default_path = pcVar3;
  }
  cVar1 = default_path[__n - 1];
  __size = __n + 2;
  if (cVar1 == '/') {
    __size = __n + 1;
  }
  pcVar3 = (char *)malloc(__size);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar4 = __n - 1;
    sVar2 = __n;
    if (cVar1 != '/') {
      sVar4 = __n;
      sVar2 = __n + 1;
    }
    strncpy(pcVar3,default_path,__n);
    pcVar3[sVar4] = '/';
    pcVar3[sVar2] = '\0';
    if (env_size != (size_t *)0x0) {
      *env_size = __size;
    }
  }
  return pcVar3;
}

Assistant:

char *environment_variable_path_create(const char *name, const char *default_path, size_t default_path_size, size_t *env_size)
{
	const char *path_ptr = getenv(name);
	char *path;
	size_t length, size, last, end;

	if (path_ptr == NULL)
	{
		if (default_path == NULL)
		{
			static const char empty_path[] = "";

			default_path = empty_path;
			default_path_size = sizeof(empty_path);
		}

		path_ptr = default_path;
		length = default_path_size - 1;
	}
	else
	{
		length = strlen(path_ptr);
	}

	last = length - 1;

	if (ENVIRONMENT_VARIABLE_PATH_SEPARATOR(path_ptr[last]))
	{
		end = length;
		size = length + 1;
	}
	else
	{
		last = length;
		end = length + 1;
		size = length + 2;
	}

	path = malloc(sizeof(char) * size);

	if (path == NULL)
	{
		return NULL;
	}

	strncpy(path, path_ptr, length);

	path[last] = ENVIRONMENT_VARIABLE_PATH_SEPARATOR_C;
	path[end] = '\0';

	if (env_size != NULL)
	{
		*env_size = size;
	}

	return path;
}